

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaNtk.c
# Opt level: O0

Cba_Man_t * Cba_ManDeriveFromGia(Cba_Man_t *pOld,Gia_Man_t *pGia,int fUseXor)

{
  Abc_Nam_t *pAVar1;
  int iVar2;
  int iVar3;
  int nOuts;
  Cba_Man_t *p_00;
  Cba_Ntk_t *pNtk_00;
  Vec_Int_t *p_01;
  Gia_Obj_t *pGVar4;
  char *pcVar5;
  bool bVar6;
  int local_dc;
  int local_9c;
  Abc_Nam_t *local_78;
  Abc_Nam_t *local_68;
  Gia_Obj_t *pObj;
  int iFon0;
  int iLit0;
  int NameId;
  int iObjNew;
  int iObj;
  int i;
  Vec_Int_t *vLit2Fon;
  Cba_Ntk_t *pNtk;
  Cba_Man_t *p;
  int fUseXor_local;
  Gia_Man_t *pGia_local;
  Cba_Man_t *pOld_local;
  
  pcVar5 = pGia->pSpec;
  if (pOld == (Cba_Man_t *)0x0) {
    local_68 = (Abc_Nam_t *)0x0;
    local_78 = (Abc_Nam_t *)0x0;
  }
  else {
    local_68 = Abc_NamRef(pOld->pStrs);
    local_78 = Abc_NamRef(pOld->pFuns);
  }
  p_00 = Cba_ManAlloc(pcVar5,1,local_68,local_78,(Abc_Nam_t *)0x0,(Hash_IntMan_t *)0x0);
  iVar2 = Abc_NamStrFindOrAdd(p_00->pStrs,pGia->pName,(int *)0x0);
  iVar3 = Gia_ManCiNum(pGia);
  nOuts = Gia_ManCoNum(pGia);
  pNtk_00 = Cba_NtkAlloc(p_00,iVar2,iVar3,nOuts,1000,2000,2000);
  iVar2 = Gia_ManObjNum(pGia);
  p_01 = Vec_IntStartFull(iVar2 << 1);
  Cba_NtkAdd(p_00,pNtk_00);
  Cba_NtkCleanObjNames(pNtk_00);
  iObjNew = 0;
  while( true ) {
    iVar2 = Vec_IntSize(pGia->vCis);
    bVar6 = false;
    if (iObjNew < iVar2) {
      pGVar4 = Gia_ManCi(pGia,iObjNew);
      NameId = Gia_ObjId(pGia,pGVar4);
      bVar6 = NameId != 0;
    }
    if (!bVar6) break;
    if (pGia->vNamesIn == (Vec_Ptr_t *)0x0) {
      local_9c = Cba_NtkNewStrId(pNtk_00,"i%d",(ulong)(uint)iObjNew);
    }
    else {
      pAVar1 = p_00->pStrs;
      pcVar5 = (char *)Vec_PtrEntry(pGia->vNamesIn,iObjNew);
      local_9c = Abc_NamStrFindOrAdd(pAVar1,pcVar5,(int *)0x0);
    }
    iVar2 = Cba_ObjAlloc(pNtk_00,CBA_OBJ_PI,0,1);
    Cba_ObjSetName(pNtk_00,iVar2,local_9c);
    iVar3 = Abc_Var2Lit(NameId,0);
    iVar2 = Cba_ObjFon0(pNtk_00,iVar2);
    Vec_IntWriteEntry(p_01,iVar3,iVar2);
    iObjNew = iObjNew + 1;
  }
  for (NameId = 0; NameId < pGia->nObjs; NameId = NameId + 1) {
    pGVar4 = Gia_ManObj(pGia,NameId);
    iVar2 = Gia_ObjIsAnd(pGVar4);
    if (iVar2 != 0) {
      Cba_NtkInsertGiaObj(pNtk_00,pGia,NameId,p_01,fUseXor);
    }
  }
  iObjNew = 0;
  while( true ) {
    iVar2 = Vec_IntSize(pGia->vCos);
    bVar6 = false;
    if (iObjNew < iVar2) {
      pGVar4 = Gia_ManCo(pGia,iObjNew);
      NameId = Gia_ObjId(pGia,pGVar4);
      bVar6 = NameId != 0;
    }
    if (!bVar6) break;
    pGVar4 = Gia_ManObj(pGia,NameId);
    iVar2 = Gia_ObjFaninLit0(pGVar4,NameId);
    Cba_NtkInsertGiaLit(pNtk_00,iVar2,p_01,fUseXor);
    iObjNew = iObjNew + 1;
  }
  iObjNew = 0;
  while( true ) {
    iVar2 = Vec_IntSize(pGia->vCos);
    bVar6 = false;
    if (iObjNew < iVar2) {
      pGVar4 = Gia_ManCo(pGia,iObjNew);
      NameId = Gia_ObjId(pGia,pGVar4);
      bVar6 = NameId != 0;
    }
    if (!bVar6) break;
    pGVar4 = Gia_ManObj(pGia,NameId);
    iVar2 = Gia_ObjFaninLit0(pGVar4,NameId);
    iVar2 = Cba_NtkInsertGiaLit(pNtk_00,iVar2,p_01,fUseXor);
    iVar3 = Cba_ObjAlloc(pNtk_00,CBA_BOX_BUF,1,1);
    Cba_ObjSetFinFon(pNtk_00,iVar3,0,iVar2);
    iVar2 = Cba_ObjFon0(pNtk_00,iVar3);
    if (pGia->vNamesOut == (Vec_Ptr_t *)0x0) {
      local_dc = Cba_NtkNewStrId(pNtk_00,"o%d",(ulong)(uint)iObjNew);
    }
    else {
      pAVar1 = p_00->pStrs;
      pcVar5 = (char *)Vec_PtrEntry(pGia->vNamesOut,iObjNew);
      local_dc = Abc_NamStrFindOrAdd(pAVar1,pcVar5,(int *)0x0);
    }
    iVar3 = Cba_ObjAlloc(pNtk_00,CBA_OBJ_PO,1,0);
    Cba_ObjSetName(pNtk_00,iVar3,local_dc);
    Cba_ObjSetFinFon(pNtk_00,iVar3,0,iVar2);
    iObjNew = iObjNew + 1;
  }
  Cba_NtkCleanFonNames(pNtk_00);
  Cba_NtkCreateFonNames(pNtk_00,"a");
  Vec_IntFree(p_01);
  return p_00;
}

Assistant:

Cba_Man_t * Cba_ManDeriveFromGia( Cba_Man_t * pOld, Gia_Man_t * pGia, int fUseXor )
{
    Cba_Man_t * p = Cba_ManAlloc( pGia->pSpec, 1, pOld ? Abc_NamRef(pOld->pStrs) : NULL, pOld ? Abc_NamRef(pOld->pFuns) : NULL, NULL, NULL );
    Cba_Ntk_t * pNtk = Cba_NtkAlloc( p, Abc_NamStrFindOrAdd(p->pStrs, pGia->pName, NULL), Gia_ManCiNum(pGia), Gia_ManCoNum(pGia), 1000, 2000, 2000 );
    Vec_Int_t * vLit2Fon = Vec_IntStartFull( 2*Gia_ManObjNum(pGia) );
    int i, iObj, iObjNew, NameId, iLit0, iFon0;
    Gia_Obj_t * pObj;
    //Cba_ManPrepareTypeNames( p );
    Cba_NtkAdd( p, pNtk );
    Cba_NtkCleanObjNames( pNtk );
    Gia_ManForEachCiId( pGia, iObj, i )
    {
        NameId = pGia->vNamesIn? Abc_NamStrFindOrAdd(p->pStrs, (char*)Vec_PtrEntry(pGia->vNamesIn, i), NULL) : Cba_NtkNewStrId(pNtk, "i%d", i);
        iObjNew = Cba_ObjAlloc( pNtk, CBA_OBJ_PI, 0, 1 );
        Cba_ObjSetName( pNtk, iObjNew, NameId );
        Vec_IntWriteEntry( vLit2Fon, Abc_Var2Lit(iObj, 0), Cba_ObjFon0(pNtk, iObjNew) );
    }
    Gia_ManForEachAndId( pGia, iObj )
        Cba_NtkInsertGiaObj( pNtk, pGia, iObj, vLit2Fon, fUseXor );
    // create inverters if needed
    Gia_ManForEachCoId( pGia, iObj, i )
    {
        pObj = Gia_ManObj( pGia, iObj );
        iLit0 = Gia_ObjFaninLit0( pObj, iObj );
        iFon0 = Cba_NtkInsertGiaLit( pNtk, iLit0, vLit2Fon, fUseXor ); // can be const!
    }
    Gia_ManForEachCoId( pGia, iObj, i )
    {
        pObj = Gia_ManObj( pGia, iObj );
        iLit0 = Gia_ObjFaninLit0( pObj, iObj );
        iFon0 = Cba_NtkInsertGiaLit( pNtk, iLit0, vLit2Fon, fUseXor ); // can be const!
        iObjNew = Cba_ObjAlloc( pNtk, CBA_BOX_BUF, 1, 1 );
        Cba_ObjSetFinFon( pNtk, iObjNew, 0, iFon0 );
        iFon0 = Cba_ObjFon0(pNtk, iObjNew); // non-const fon unique for this output
        NameId = pGia->vNamesOut? Abc_NamStrFindOrAdd(p->pStrs, (char*)Vec_PtrEntry(pGia->vNamesOut, i), NULL) : Cba_NtkNewStrId(pNtk, "o%d", i);
        iObjNew = Cba_ObjAlloc( pNtk, CBA_OBJ_PO, 1, 0 );
        Cba_ObjSetName( pNtk, iObjNew, NameId );
        Cba_ObjSetFinFon( pNtk, iObjNew, 0, iFon0 );
    }
    Cba_NtkCleanFonNames( pNtk );
    Cba_NtkCreateFonNames( pNtk, "a" );
    Vec_IntFree( vLit2Fon );
    return p;
}